

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TracerUtil.cpp
# Opt level: O3

shared_ptr<jaegertracing::testutils::TracerUtil::ResourceHandle>
jaegertracing::testutils::TracerUtil::installGlobalTracer(void)

{
  _Head_base<0UL,_jaegertracing::testutils::TracerUtil::ResourceHandle_*,_false> _Var1;
  ResourceHandle *pRVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  pointer *__ptr;
  __shared_ptr<jaegertracing::testutils::TracerUtil::ResourceHandle,(__gnu_cxx::_Lock_policy)2>
  *in_RDI;
  shared_ptr<jaegertracing::testutils::TracerUtil::ResourceHandle> sVar4;
  _Head_base<0UL,_jaegertracing::testutils::TracerUtil::ResourceHandle_*,_false> local_648;
  element_type *local_640;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_638;
  duration local_630;
  string local_628;
  undefined1 local_608 [8];
  _Alloc_hider local_600;
  char local_5f0 [16];
  duration local_5e0;
  undefined1 *local_5d8;
  long local_5d0;
  undefined1 local_5c8 [16];
  string local_5b8;
  vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> local_598;
  string local_578;
  string local_558;
  duration local_538;
  string local_530;
  Config local_510;
  shared_ptr<opentracing::v3::Tracer> tracer;
  element_type local_4a8 [16];
  _Alloc_hider local_498;
  char local_488 [16];
  _Alloc_hider local_478;
  char local_468 [16];
  _Alloc_hider local_458;
  char local_448 [16];
  undefined1 local_438 [136];
  NullStatsFactory factory;
  _Alloc_hider local_398;
  char local_388 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_378;
  char local_368 [16];
  undefined1 local_358 [16];
  ostringstream samplingServerURLStream;
  ios_base local_2d8 [264];
  Config config;
  
  pRVar2 = (ResourceHandle *)operator_new(0x10);
  MockAgent::make();
  local_648._M_head_impl = pRVar2;
  MockAgent::start((pRVar2->_mockAgent).
                   super___shared_ptr<jaegertracing::testutils::MockAgent,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&samplingServerURLStream);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&samplingServerURLStream,"http://",7);
  memcpy(&config,&(((local_648._M_head_impl)->_mockAgent).
                   super___shared_ptr<jaegertracing::testutils::MockAgent,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->_httpAddress,0x88);
  net::IPAddress::authority_abi_cxx11_((string *)local_438,(IPAddress *)&config);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&samplingServerURLStream,(char *)local_438._0_8_,local_438._8_8_);
  if ((undefined1 *)local_438._0_8_ != local_438 + 0x10) {
    operator_delete((void *)local_438._0_8_);
  }
  local_5b8._M_dataplus._M_p = (pointer)&local_5b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5b8,"const","");
  std::__cxx11::stringbuf::str();
  local_538.__r = 0;
  samplers::Config::Config(&local_510,&local_5b8,1.0,&local_530,0,&local_538);
  local_630.__r = 0;
  memcpy((IPAddress *)local_438,
         &((((local_648._M_head_impl)->_mockAgent).
            super___shared_ptr<jaegertracing::testutils::MockAgent,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr)->_transport)._serverAddr,0x88);
  net::IPAddress::authority_abi_cxx11_(&local_558,(IPAddress *)local_438);
  local_628._M_dataplus._M_p = (pointer)&local_628.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_628);
  reporters::Config::Config((Config *)&factory,0,&local_630,false,&local_558,&local_628);
  propagation::HeadersConfig::HeadersConfig((HeadersConfig *)&tracer);
  local_5d8 = local_5c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5d8,"");
  local_608[0] = false;
  local_600._M_p = local_5f0;
  std::__cxx11::string::_M_construct<char*>((string *)&local_600,local_5d8,local_5d8 + local_5d0);
  local_5e0.__r = 0;
  local_578._M_dataplus._M_p = (pointer)&local_578.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_578);
  local_598.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_598.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_598.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Config::Config(&config,false,&local_510,(Config *)&factory,(HeadersConfig *)&tracer,
                 (RestrictionsConfig *)local_608,&local_578,&local_598);
  std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector(&local_598);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_578._M_dataplus._M_p != &local_578.field_2) {
    operator_delete(local_578._M_dataplus._M_p);
  }
  if (local_600._M_p != local_5f0) {
    operator_delete(local_600._M_p);
  }
  if (local_5d8 != local_5c8) {
    operator_delete(local_5d8);
  }
  if (local_458._M_p != local_448) {
    operator_delete(local_458._M_p);
  }
  if (local_478._M_p != local_468) {
    operator_delete(local_478._M_p);
  }
  if (local_498._M_p != local_488) {
    operator_delete(local_498._M_p);
  }
  if (tracer.super___shared_ptr<opentracing::v3::Tracer,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      local_4a8) {
    operator_delete(tracer.super___shared_ptr<opentracing::v3::Tracer,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr);
  }
  if ((char *)local_378._M_allocated_capacity != local_368) {
    operator_delete((void *)local_378._M_allocated_capacity);
  }
  if (local_398._M_p != local_388) {
    operator_delete(local_398._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_628._M_dataplus._M_p != &local_628.field_2) {
    operator_delete(local_628._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_558._M_dataplus._M_p != &local_558.field_2) {
    operator_delete(local_558._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_510._samplingServerURL._M_dataplus._M_p != &local_510._samplingServerURL.field_2) {
    operator_delete(local_510._samplingServerURL._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_510._type._M_dataplus._M_p != &local_510._type.field_2) {
    operator_delete(local_510._type._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_530._M_dataplus._M_p != &local_530.field_2) {
    operator_delete(local_530._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
    operator_delete(local_5b8._M_dataplus._M_p);
  }
  local_438._0_8_ = local_438 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"test-service","");
  jaegertracing::logging::nullLogger();
  std::__shared_ptr<jaegertracing::logging::Logger,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<jaegertracing::logging::Logger,std::default_delete<jaegertracing::logging::Logger>,void>
            ((__shared_ptr<jaegertracing::logging::Logger,(__gnu_cxx::_Lock_policy)2> *)&local_510,
             (unique_ptr<jaegertracing::logging::Logger,_std::default_delete<jaegertracing::logging::Logger>_>
              *)local_608);
  factory.super_StatsFactory._vptr_StatsFactory = (StatsFactory)&PTR__StatsFactory_0015a6d8;
  jaegertracing::Tracer::make
            ((string *)&tracer,(Config *)local_438,(shared_ptr *)&config,(StatsFactory *)&local_510,
             (int)&factory);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_510._type._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_510._type._M_string_length);
  }
  if ((long *)CONCAT71(local_608._1_7_,local_608[0]) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT71(local_608._1_7_,local_608[0]) + 8))();
  }
  if ((undefined1 *)local_438._0_8_ != local_438 + 0x10) {
    operator_delete((void *)local_438._0_8_);
  }
  local_640 = tracer.super___shared_ptr<opentracing::v3::Tracer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_638 = tracer.super___shared_ptr<opentracing::v3::Tracer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
  if (tracer.super___shared_ptr<opentracing::v3::Tracer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (tracer.super___shared_ptr<opentracing::v3::Tracer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (tracer.super___shared_ptr<opentracing::v3::Tracer,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (tracer.super___shared_ptr<opentracing::v3::Tracer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (tracer.super___shared_ptr<opentracing::v3::Tracer,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  opentracing::v3::Tracer::InitGlobal(local_358,&local_640);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_358._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_358._8_8_);
  }
  if (local_638 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_638);
  }
  std::__shared_ptr<jaegertracing::testutils::TracerUtil::ResourceHandle,(__gnu_cxx::_Lock_policy)2>
  ::
  __shared_ptr<jaegertracing::testutils::TracerUtil::ResourceHandle,std::default_delete<jaegertracing::testutils::TracerUtil::ResourceHandle>,void>
            (in_RDI,(unique_ptr<jaegertracing::testutils::TracerUtil::ResourceHandle,_std::default_delete<jaegertracing::testutils::TracerUtil::ResourceHandle>_>
                     *)&local_648);
  if (tracer.super___shared_ptr<opentracing::v3::Tracer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (tracer.super___shared_ptr<opentracing::v3::Tracer,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  Config::~Config(&config);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&samplingServerURLStream);
  std::ios_base::~ios_base(local_2d8);
  _Var1._M_head_impl = local_648._M_head_impl;
  _Var3._M_pi = extraout_RDX;
  if (local_648._M_head_impl != (ResourceHandle *)0x0) {
    ResourceHandle::~ResourceHandle(local_648._M_head_impl);
    operator_delete(_Var1._M_head_impl);
    _Var3._M_pi = extraout_RDX_00;
  }
  sVar4.
  super___shared_ptr<jaegertracing::testutils::TracerUtil::ResourceHandle,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var3._M_pi;
  sVar4.
  super___shared_ptr<jaegertracing::testutils::TracerUtil::ResourceHandle,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)in_RDI;
  return (shared_ptr<jaegertracing::testutils::TracerUtil::ResourceHandle>)
         sVar4.
         super___shared_ptr<jaegertracing::testutils::TracerUtil::ResourceHandle,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

std::shared_ptr<ResourceHandle> installGlobalTracer()
{
    std::unique_ptr<ResourceHandle> handle(new ResourceHandle());
    handle->_mockAgent->start();
    std::ostringstream samplingServerURLStream;
    samplingServerURLStream
        << "http://" << handle->_mockAgent->samplingServerAddress().authority();
    Config config(
        false,
        samplers::Config("const",
                         1,
                         samplingServerURLStream.str(),
                         0,
                         samplers::Config::Clock::duration()),
        reporters::Config(0,
                          reporters::Config::Clock::duration(),
                          false,
                          handle->_mockAgent->spanServerAddress().authority()),
        propagation::HeadersConfig(),
        baggage::RestrictionsConfig());

    auto tracer = Tracer::make("test-service", config, logging::nullLogger());
    opentracing::Tracer::InitGlobal(tracer);
    return std::move(handle);
}